

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_cast(lua_State *L)

{
  lua_State *plVar1;
  CTypeID CVar2;
  TValue *pTVar3;
  TValue *L_00;
  void *pvVar4;
  uint64_t in_RDI;
  GCcdata *cd;
  TValue *o;
  CType *d;
  CTypeID id;
  CTState *cts;
  CTState *cts_1;
  CType *ct;
  GCcdata *cd_1;
  undefined8 in_stack_fffffffffffffec8;
  lua_State *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee0;
  lua_State *local_f8;
  CTypeID flags;
  TValue *o_00;
  lua_State *in_stack_ffffffffffffff30;
  TValue *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  TValue *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  lua_State *in_stack_ffffffffffffff68;
  
  pTVar3 = (TValue *)(ulong)*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x194);
  pTVar3[2].u64 = in_RDI;
  CVar2 = ffi_checkctype(in_stack_ffffffffffffff68,
                         (CTState *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff58);
  plVar1 = (lua_State *)(pTVar3->u64 + (ulong)CVar2 * 0x10);
  while (local_f8 = plVar1, (local_f8->nextgc).gcptr32 >> 0x1c == 8) {
    in_stack_ffffffffffffff44 = (local_f8->nextgc).gcptr32 & 0xffff;
    plVar1 = (lua_State *)(pTVar3->u64 + (ulong)in_stack_ffffffffffffff44 * 0x10);
    in_stack_ffffffffffffff30 = local_f8;
    in_stack_ffffffffffffff38 = pTVar3;
  }
  flags = CVar2;
  o_00 = pTVar3;
  L_00 = lj_lib_checkany(in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  *(TValue **)(in_RDI + 0x18) = L_00 + 1;
  if ((((local_f8->nextgc).gcptr32 >> 0x1c != 0) && ((local_f8->nextgc).gcptr32 >> 0x1c != 2)) &&
     ((local_f8->nextgc).gcptr32 >> 0x1c != 5)) {
    lj_err_arg((lua_State *)&L_00->field_2,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               (ErrMsg)in_stack_fffffffffffffec8);
  }
  if (((L_00->field_2).it != 0xfffffff5) || (*(ushort *)((ulong)(L_00->u32).lo + 6) != CVar2)) {
    pvVar4 = lj_mem_newgco((lua_State *)CONCAT44(CVar2,in_stack_fffffffffffffee0),
                           (GCSize)((ulong)local_f8 >> 0x20));
    *(undefined1 *)((long)pvVar4 + 5) = 10;
    *(short *)((long)pvVar4 + 6) = (short)CVar2;
    *(long *)((ulong)*(uint *)(pTVar3[2].u64 + 8) + 0xe0) =
         *(long *)((ulong)*(uint *)(pTVar3[2].u64 + 8) + 0xe0) + 1;
    lj_cconv_ct_tv((CTState *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (CType *)&in_stack_ffffffffffffff38->field_2,(uint8_t *)in_stack_ffffffffffffff30
                   ,o_00,flags);
    (L_00->u32).lo = (uint32_t)pvVar4;
    (L_00->field_2).it = 0xfffffff5;
    if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x54) <=
        *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x50)) {
      lj_gc_step(local_f8);
    }
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_cast)	LJLIB_REC(ffi_new)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CType *d = ctype_raw(cts, id);
  TValue *o = lj_lib_checkany(L, 2);
  L->top = o+1;  /* Make sure this is the last item on the stack. */
  if (!(ctype_isnum(d->info) || ctype_isptr(d->info) || ctype_isenum(d->info)))
    lj_err_arg(L, 1, LJ_ERR_FFI_INVTYPE);
  if (!(tviscdata(o) && cdataV(o)->ctypeid == id)) {
    GCcdata *cd = lj_cdata_new(cts, id, d->size);
    lj_cconv_ct_tv(cts, d, cdataptr(cd), o, CCF_CAST);
    setcdataV(L, o, cd);
    lj_gc_check(L);
  }
  return 1;
}